

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v8::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  size_t sVar1;
  ptrdiff_t _Num;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  
  if (begin != end) {
    sVar1 = this->size_;
    do {
      uVar3 = (long)end - (long)begin;
      uVar2 = this->capacity_;
      if (uVar2 < sVar1 + uVar3) {
        (**this->_vptr_buffer)(this);
        sVar1 = this->size_;
        uVar2 = this->capacity_;
      }
      __n = uVar2 - sVar1;
      if (uVar3 <= uVar2 - sVar1) {
        __n = uVar3;
      }
      if (__n != 0) {
        memmove(this->ptr_ + sVar1,begin,__n);
        sVar1 = this->size_;
      }
      sVar1 = sVar1 + __n;
      this->size_ = sVar1;
      begin = begin + __n;
    } while (begin != end);
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  }
}